

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

Float __thiscall pbrt::BilinearPatch::PDF(BilinearPatch *this,ShapeSampleContext *ctx,Vector3f wi)

{
  Point3f *pPVar1;
  Point3f *pPVar2;
  float *s;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  int iVar12;
  BilinearPatchMesh *mesh;
  int *piVar13;
  Point3f *pPVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  bool bVar26;
  long lVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  Float FVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  Point3f PVar53;
  Vector3f a;
  Vector3f a_00;
  Vector3f b;
  Vector3f b_00;
  Vector3f c;
  Vector3f c_00;
  Vector3f d;
  Vector3f d_00;
  optional<pbrt::ShapeIntersection> isect;
  Ray ray;
  Tuple3<pbrt::Point3,_float> local_258;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  float local_220;
  float local_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  Point3f *local_1f8;
  float local_1f0;
  float local_1ec;
  float local_1e8;
  float local_1e4;
  float local_1e0;
  float local_1dc;
  undefined1 local_1d8 [16];
  Tuple3<pbrt::Vector3,_float> local_1c8;
  undefined1 local_1b8 [16];
  long local_1a0;
  Tuple3<pbrt::Point3,_float> local_198;
  Tuple3<pbrt::Vector3,_float> local_188;
  Tuple3<pbrt::Vector3,_float> local_178;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_168;
  char local_68;
  Ray local_58;
  undefined1 extraout_var [56];
  
  local_1c8.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar38._8_56_ = wi._8_56_;
  auVar38._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_1c8._0_8_ = vmovlps_avx(auVar38._0_16_);
  PVar53 = ShapeSampleContext::OffsetRayOrigin(ctx,(Vector3f *)&local_1c8);
  local_58.o.super_Tuple3<pbrt::Point3,_float>.z = PVar53.super_Tuple3<pbrt::Point3,_float>.z;
  auVar39._0_8_ = PVar53.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar39._8_56_ = auVar38._8_56_;
  local_58.time = ctx->time;
  local_58.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar39._0_16_);
  local_58.d.super_Tuple3<pbrt::Vector3,_float>.x = local_1c8.x;
  local_58.d.super_Tuple3<pbrt::Vector3,_float>.y = local_1c8.y;
  local_58.d.super_Tuple3<pbrt::Vector3,_float>.z = local_1c8.z;
  local_58.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  Intersect((optional<pbrt::ShapeIntersection> *)&local_168.__align,this,&local_58,INFINITY);
  FVar33 = 0.0;
  if (local_68 == '\x01') {
    mesh = *(BilinearPatchMesh **)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
    lVar27 = (long)this->blpIndex;
    piVar13 = mesh->vertexIndices;
    pPVar14 = mesh->p;
    lVar28 = (long)piVar13[lVar27 * 4];
    local_1a0 = lVar28 * 3;
    local_1f8 = pPVar14 + piVar13[lVar27 * 4 + 1];
    iVar11 = piVar13[lVar27 * 4 + 2];
    iVar12 = piVar13[lVar27 * 4 + 3];
    local_208._0_4_ =
         pPVar14[lVar28].super_Tuple3<pbrt::Point3,_float>.x -
         ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low +
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high) *
         0.5;
    local_218._0_4_ =
         pPVar14[lVar28].super_Tuple3<pbrt::Point3,_float>.y -
         ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high) *
         0.5;
    local_1d8._0_4_ =
         pPVar14[lVar28].super_Tuple3<pbrt::Point3,_float>.z -
         ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) *
         0.5;
    fVar52 = (float)local_208._0_4_ * (float)local_208._0_4_ +
             (float)local_218._0_4_ * (float)local_218._0_4_ +
             (float)local_1d8._0_4_ * (float)local_1d8._0_4_;
    if (fVar52 < 0.0) {
      local_248._0_4_ = sqrtf(fVar52);
    }
    else {
      auVar29 = vsqrtss_avx(ZEXT416((uint)fVar52),ZEXT416((uint)fVar52));
      local_248._0_4_ = auVar29._0_4_;
    }
    pPVar1 = pPVar14 + iVar11;
    fVar48 = (local_1f8->super_Tuple3<pbrt::Point3,_float>).x -
             ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
              low + (ctx->pi).super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high) * 0.5;
    fVar41 = (local_1f8->super_Tuple3<pbrt::Point3,_float>).y -
             ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
              low + (ctx->pi).super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high) * 0.5;
    local_238._0_4_ =
         (local_1f8->super_Tuple3<pbrt::Point3,_float>).z -
         ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) *
         0.5;
    fVar52 = fVar48 * fVar48 + fVar41 * fVar41 + (float)local_238._0_4_ * (float)local_238._0_4_;
    if (fVar52 < 0.0) {
      local_1b8._0_4_ = sqrtf(fVar52);
    }
    else {
      auVar29 = vsqrtss_avx(ZEXT416((uint)fVar52),ZEXT416((uint)fVar52));
      local_1b8._0_4_ = auVar29._0_4_;
    }
    pPVar2 = pPVar14 + iVar12;
    local_1e0 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x -
                ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x
                 .low + (ctx->pi).super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high) * 0.5;
    local_1e4 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y -
                ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y
                 .low + (ctx->pi).super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high) * 0.5;
    local_1dc = (pPVar1->super_Tuple3<pbrt::Point3,_float>).z -
                ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z
                 .low + (ctx->pi).super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
    fVar52 = local_1e0 * local_1e0 + local_1e4 * local_1e4 + local_1dc * local_1dc;
    if (fVar52 < 0.0) {
      local_21c = sqrtf(fVar52);
    }
    else {
      auVar29 = vsqrtss_avx(ZEXT416((uint)fVar52),ZEXT416((uint)fVar52));
      local_21c = auVar29._0_4_;
    }
    local_1e8 = (pPVar2->super_Tuple3<pbrt::Point3,_float>).x -
                ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x
                 .low + (ctx->pi).super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high) * 0.5;
    local_1ec = (pPVar2->super_Tuple3<pbrt::Point3,_float>).y -
                ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y
                 .low + (ctx->pi).super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high) * 0.5;
    local_1f0 = (pPVar2->super_Tuple3<pbrt::Point3,_float>).z -
                ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z
                 .low + (ctx->pi).super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
    fVar52 = local_1e8 * local_1e8 + local_1ec * local_1ec + local_1f0 * local_1f0;
    if (fVar52 < 0.0) {
      local_220 = sqrtf(fVar52);
    }
    else {
      auVar29 = vsqrtss_avx(ZEXT416((uint)fVar52),ZEXT416((uint)fVar52));
      local_220 = auVar29._0_4_;
    }
    bVar26 = IsRectangle(this,mesh);
    if ((bVar26) && (mesh->imageDistribution == (PiecewiseConstant2D *)0x0)) {
      auVar29._0_4_ = (float)local_208._0_4_ / (float)local_248._0_4_;
      auVar29._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar42._0_4_ = (float)local_218._0_4_ / (float)local_248._0_4_;
      auVar42._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar29 = vinsertps_avx(auVar29,auVar42,0x10);
      auVar30._0_4_ = fVar48 / (float)local_1b8._0_4_;
      auVar30._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar43._0_4_ = fVar41 / (float)local_1b8._0_4_;
      auVar43._4_12_ = SUB6012((undefined1  [60])0x0,0);
      local_218 = vinsertps_avx(auVar30,auVar43,0x10);
      auVar31._0_4_ = local_1e0 / local_21c;
      auVar31._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar44._0_4_ = local_1e4 / local_21c;
      auVar44._4_12_ = SUB6012((undefined1  [60])0x0,0);
      local_208 = vinsertps_avx(auVar31,auVar44,0x10);
      fVar52 = (float)local_1d8._0_4_ / (float)local_248._0_4_;
      b.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_238._0_4_ / (float)local_1b8._0_4_;
      d.super_Tuple3<pbrt::Vector3,_float>.z = local_1dc / local_21c;
      auVar32._0_4_ = local_1e8 / local_220;
      auVar32._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar45._0_4_ = local_1ec / local_220;
      auVar45._4_12_ = SUB6012((undefined1  [60])0x0,0);
      local_1b8 = vinsertps_avx(auVar32,auVar45,0x10);
      c.super_Tuple3<pbrt::Vector3,_float>.z = local_1f0 / local_220;
      local_238._0_4_ = b.super_Tuple3<pbrt::Vector3,_float>.z;
      a.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar29._0_8_;
      a.super_Tuple3<pbrt::Vector3,_float>.z = fVar52;
      b.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_218._0_8_;
      c.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_1b8._0_8_;
      d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_208._0_8_;
      local_1d8 = auVar29;
      local_248._0_4_ = d.super_Tuple3<pbrt::Vector3,_float>.z;
      FVar33 = SphericalQuadArea(a,b,c,d);
      auVar32 = local_1b8;
      auVar31 = local_1d8;
      auVar30 = local_208;
      auVar29 = local_218;
      if (0.0001 < FVar33) {
        a_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar52;
        a_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_1d8._0_4_;
        a_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1d8._4_4_;
        b_00.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_238._0_4_;
        b_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_218._0_4_;
        b_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_218._4_4_;
        c_00.super_Tuple3<pbrt::Vector3,_float>.z = c.super_Tuple3<pbrt::Vector3,_float>.z;
        c_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_1b8._0_4_;
        c_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1b8._4_4_;
        d_00.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_248._0_4_;
        d_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_208._0_4_;
        d_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_208._4_4_;
        local_218 = auVar29;
        local_208 = auVar30;
        local_1d8 = auVar31;
        local_1b8 = auVar32;
        FVar33 = SphericalQuadArea(a_00,b_00,c_00,d_00);
        if (((((ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x == 0.0) &&
             (fVar52 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y, fVar52 == 0.0)) &&
            (!NAN(fVar52))) &&
           ((fVar52 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z, fVar52 == 0.0 &&
            (!NAN(fVar52))))) {
          return 1.0 / FVar33;
        }
        s = &(pPVar14->super_Tuple3<pbrt::Point3,_float>).x + local_1a0;
        auVar9._0_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
        auVar9._4_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
        auVar9._8_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
        auVar9._12_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
             high;
        uVar6 = *(undefined8 *)
                 &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                  x.high;
        auVar29 = vinsertps_avx(auVar9,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                                                     high),0x10);
        auVar34._0_4_ = (float)uVar6 + auVar29._0_4_;
        auVar34._4_4_ = (float)((ulong)uVar6 >> 0x20) + auVar29._4_4_;
        auVar34._8_4_ = auVar29._8_4_ + 0.0;
        auVar34._12_4_ = auVar29._12_4_ + 0.0;
        auVar15._8_4_ = 0x3f000000;
        auVar15._0_8_ = 0x3f0000003f000000;
        auVar15._12_4_ = 0x3f000000;
        auVar29 = vmulps_avx512vl(auVar34,auVar15);
        local_258.z = ((ctx->pi).super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
                      (ctx->pi).super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
        local_258._0_8_ = vmovlps_avx(auVar29);
        fVar48 = *s - local_258.x;
        fVar41 = s[1] - local_258.y;
        local_248._0_4_ = s[2] - local_258.z;
        fVar52 = fVar48 * fVar48 + fVar41 * fVar41 + (float)local_248._0_4_ * (float)local_248._0_4_
        ;
        local_1d8 = ZEXT416((uint)(1.0 / FVar33));
        if (fVar52 < 0.0) {
          local_208._0_4_ = fVar48;
          local_218._0_4_ = fVar41;
          fVar52 = sqrtf(fVar52);
          fVar41 = (float)local_218._0_4_;
        }
        else {
          auVar29 = vsqrtss_avx(ZEXT416((uint)fVar52),ZEXT416((uint)fVar52));
          fVar52 = auVar29._0_4_;
          local_208._0_4_ = fVar48;
        }
        fVar48 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
        auVar30 = ZEXT416((uint)(((float)local_248._0_4_ / fVar52) * fVar48));
        auVar29 = vfmadd132ss_fma(ZEXT416((uint)(fVar41 / fVar52)),auVar30,
                                  ZEXT416((uint)(ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y));
        auVar30 = vfmsub213ss_fma(ZEXT416((uint)((float)local_248._0_4_ / fVar52)),
                                  ZEXT416((uint)fVar48),auVar30);
        local_208 = vfmadd231ss_fma(ZEXT416((uint)(auVar29._0_4_ + auVar30._0_4_)),
                                    ZEXT416((uint)((float)local_208._0_4_ / fVar52)),
                                    ZEXT416((uint)(ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x));
        fVar48 = (local_1f8->super_Tuple3<pbrt::Point3,_float>).x - local_258.x;
        local_248._0_4_ = (local_1f8->super_Tuple3<pbrt::Point3,_float>).y - local_258.y;
        fVar41 = (local_1f8->super_Tuple3<pbrt::Point3,_float>).z - local_258.z;
        fVar52 = fVar48 * fVar48 + (float)local_248._0_4_ * (float)local_248._0_4_ + fVar41 * fVar41
        ;
        if (fVar52 < 0.0) {
          local_218._0_4_ = fVar48;
          local_238._0_4_ = fVar41;
          fVar52 = sqrtf(fVar52);
          fVar41 = (float)local_238._0_4_;
        }
        else {
          auVar29 = vsqrtss_avx(ZEXT416((uint)fVar52),ZEXT416((uint)fVar52));
          fVar52 = auVar29._0_4_;
          local_218._0_4_ = fVar48;
        }
        fVar48 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
        auVar30 = ZEXT416((uint)((fVar41 / fVar52) * fVar48));
        auVar29 = vfmadd132ss_fma(ZEXT416((uint)((float)local_248._0_4_ / fVar52)),auVar30,
                                  ZEXT416((uint)(ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y));
        auVar30 = vfmsub213ss_fma(ZEXT416((uint)(fVar41 / fVar52)),ZEXT416((uint)fVar48),auVar30);
        local_218 = vfmadd231ss_fma(ZEXT416((uint)(auVar29._0_4_ + auVar30._0_4_)),
                                    ZEXT416((uint)((float)local_218._0_4_ / fVar52)),
                                    ZEXT416((uint)(ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x));
        local_248._0_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x - local_258.x;
        fVar48 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y - local_258.y;
        fVar41 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).z - local_258.z;
        fVar52 = (float)local_248._0_4_ * (float)local_248._0_4_ + fVar48 * fVar48 + fVar41 * fVar41
        ;
        if (fVar52 < 0.0) {
          local_238._0_4_ = fVar48;
          fVar52 = sqrtf(fVar52);
          fVar48 = (float)local_238._0_4_;
        }
        else {
          auVar29 = vsqrtss_avx(ZEXT416((uint)fVar52),ZEXT416((uint)fVar52));
          fVar52 = auVar29._0_4_;
        }
        fVar3 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
        auVar30 = ZEXT416((uint)((fVar41 / fVar52) * fVar3));
        auVar29 = vfmadd132ss_fma(ZEXT416((uint)(fVar48 / fVar52)),auVar30,
                                  ZEXT416((uint)(ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y));
        auVar30 = vfmsub213ss_fma(ZEXT416((uint)(fVar41 / fVar52)),ZEXT416((uint)fVar3),auVar30);
        local_248 = vfmadd231ss_fma(ZEXT416((uint)(auVar29._0_4_ + auVar30._0_4_)),
                                    ZEXT416((uint)((float)local_248._0_4_ / fVar52)),
                                    ZEXT416((uint)(ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x));
        fVar48 = (pPVar2->super_Tuple3<pbrt::Point3,_float>).x - local_258.x;
        fVar41 = (pPVar2->super_Tuple3<pbrt::Point3,_float>).y - local_258.y;
        fVar3 = (pPVar2->super_Tuple3<pbrt::Point3,_float>).z - local_258.z;
        fVar52 = fVar48 * fVar48 + fVar41 * fVar41 + fVar3 * fVar3;
        if (fVar52 < 0.0) {
          local_238._0_4_ = fVar48;
          fVar52 = sqrtf(fVar52);
        }
        else {
          auVar29 = vsqrtss_avx(ZEXT416((uint)fVar52),ZEXT416((uint)fVar52));
          fVar52 = auVar29._0_4_;
          local_238._0_4_ = fVar48;
        }
        fVar48 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
        auVar30 = ZEXT416((uint)((fVar3 / fVar52) * fVar48));
        auVar29 = vfmadd132ss_fma(ZEXT416((uint)(fVar41 / fVar52)),auVar30,
                                  ZEXT416((uint)(ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y));
        auVar30 = vfmsub213ss_fma(ZEXT416((uint)(fVar3 / fVar52)),ZEXT416((uint)fVar48),auVar30);
        local_238 = vfmadd231ss_fma(ZEXT416((uint)(auVar29._0_4_ + auVar30._0_4_)),
                                    ZEXT416((uint)((float)local_238._0_4_ / fVar52)),
                                    ZEXT416((uint)(ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x));
        uVar4 = (local_1f8->super_Tuple3<pbrt::Point3,_float>).x;
        uVar7 = (local_1f8->super_Tuple3<pbrt::Point3,_float>).y;
        auVar35._4_4_ = uVar7;
        auVar35._0_4_ = uVar4;
        auVar35._8_8_ = 0;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = *(ulong *)s;
        auVar29 = vsubps_avx(auVar35,auVar46);
        local_178.z = (local_1f8->super_Tuple3<pbrt::Point3,_float>).z - s[2];
        local_178._0_8_ = vmovlps_avx(auVar29);
        uVar5 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
        uVar8 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
        auVar36._4_4_ = uVar8;
        auVar36._0_4_ = uVar5;
        auVar36._8_8_ = 0;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = *(ulong *)s;
        auVar29 = vsubps_avx(auVar36,auVar47);
        local_188.z = (pPVar1->super_Tuple3<pbrt::Point3,_float>).z - s[2];
        local_188._0_8_ = vmovlps_avx(auVar29);
        auVar24._4_4_ = local_168._4_4_;
        auVar24._0_4_ = local_168._0_4_;
        auVar24._8_4_ = local_168._8_4_;
        auVar24._12_4_ = local_168._12_4_;
        auVar29 = vinsertps_avx(auVar24,ZEXT416((uint)local_168._12_4_),0x10);
        auVar37._0_4_ = (float)local_168._4_4_ + auVar29._0_4_;
        auVar37._4_4_ = (float)local_168._8_4_ + auVar29._4_4_;
        auVar37._8_4_ = auVar29._8_4_ + 0.0;
        auVar37._12_4_ = auVar29._12_4_ + 0.0;
        auVar16._8_4_ = 0x3f000000;
        auVar16._0_8_ = 0x3f0000003f000000;
        auVar16._12_4_ = 0x3f000000;
        auVar29 = vmulps_avx512vl(auVar37,auVar16);
        local_198.z = ((float)local_168._16_4_ + (float)local_168._20_4_) * 0.5;
        local_198._0_8_ = vmovlps_avx(auVar29);
        auVar40._0_8_ =
             InvertSphericalRectangleSample
                       ((Point3f *)&local_258,(Point3f *)s,(Vector3f *)&local_178,
                        (Vector3f *)&local_188,(Point3f *)&local_198);
        auVar40._8_56_ = extraout_var;
        fVar48 = 0.0;
        fVar52 = auVar40._0_4_;
        if ((0.0 <= fVar52) && (fVar52 <= 1.0)) {
          auVar29 = vmovshdup_avx(auVar40._0_16_);
          fVar41 = auVar29._0_4_;
          if ((0.0 <= fVar41) && (fVar41 <= 1.0)) {
            auVar17._8_4_ = 0x7fffffff;
            auVar17._0_8_ = 0x7fffffff7fffffff;
            auVar17._12_4_ = 0x7fffffff;
            auVar29 = vandps_avx512vl(local_208,auVar17);
            auVar18._8_4_ = 0x7fffffff;
            auVar18._0_8_ = 0x7fffffff7fffffff;
            auVar18._12_4_ = 0x7fffffff;
            auVar30 = vandps_avx512vl(local_218,auVar18);
            auVar19._8_4_ = 0x7fffffff;
            auVar19._0_8_ = 0x7fffffff7fffffff;
            auVar19._12_4_ = 0x7fffffff;
            auVar31 = vandps_avx512vl(local_248,auVar19);
            auVar29 = vmaxss_avx(auVar29,ZEXT416(0x3c23d70a));
            auVar30 = vmaxss_avx(auVar30,ZEXT416(0x3c23d70a));
            auVar31 = vmaxss_avx(auVar31,ZEXT416(0x3c23d70a));
            auVar20._8_4_ = 0x7fffffff;
            auVar20._0_8_ = 0x7fffffff7fffffff;
            auVar20._12_4_ = 0x7fffffff;
            auVar32 = vandps_avx512vl(local_238,auVar20);
            auVar32 = vmaxss_avx(auVar32,ZEXT416(0x3c23d70a));
            fVar3 = auVar29._0_4_ + auVar30._0_4_ + auVar31._0_4_ + auVar32._0_4_;
            fVar48 = 1.0;
            if ((fVar3 != 0.0) || (NAN(fVar3))) {
              auVar29 = vfmadd213ss_fma(auVar29,ZEXT416((uint)((1.0 - fVar52) * (1.0 - fVar41))),
                                        ZEXT416((uint)(fVar52 * (1.0 - fVar41) * auVar30._0_4_)));
              auVar29 = vfmadd213ss_fma(auVar31,ZEXT416((uint)((1.0 - fVar52) * fVar41)),auVar29);
              auVar29 = vfmadd213ss_fma(auVar32,ZEXT416((uint)(fVar52 * fVar41)),auVar29);
              fVar48 = (auVar29._0_4_ * 4.0) / fVar3;
            }
          }
        }
        return (float)local_1d8._0_4_ * fVar48;
      }
    }
    FVar33 = PDF(this,(Interaction *)&local_168.__align);
    auVar21._8_4_ = 0x80000000;
    auVar21._0_8_ = 0x8000000080000000;
    auVar21._12_4_ = 0x80000000;
    auVar29 = vxorps_avx512vl(ZEXT416((uint)local_1c8.z),auVar21);
    auVar30 = ZEXT416((uint)((float)local_168._48_4_ * auVar29._0_4_));
    auVar29 = vfnmadd132ss_fma(ZEXT416((uint)local_168._44_4_),auVar30,ZEXT416((uint)local_1c8.y));
    auVar30 = vfnmsub213ss_fma(ZEXT416((uint)local_1c8.z),ZEXT416((uint)local_168._48_4_),auVar30);
    auVar29 = vfnmadd231ss_fma(ZEXT416((uint)(auVar29._0_4_ + auVar30._0_4_)),
                               ZEXT416((uint)local_168._40_4_),ZEXT416((uint)local_1c8.x));
    auVar22._8_4_ = 0x7fffffff;
    auVar22._0_8_ = 0x7fffffff7fffffff;
    auVar22._12_4_ = 0x7fffffff;
    auVar31 = vandps_avx512vl(auVar29,auVar22);
    auVar10._0_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
    auVar10._4_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
    auVar10._8_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
    auVar10._12_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    auVar23._4_4_ = local_168._4_4_;
    auVar23._0_4_ = local_168._0_4_;
    auVar23._8_4_ = local_168._8_4_;
    auVar23._12_4_ = local_168._12_4_;
    auVar25._4_4_ = local_168._8_4_;
    auVar25._0_4_ = local_168._4_4_;
    auVar25._8_4_ = local_168._12_4_;
    auVar25._12_4_ = local_168._16_4_;
    fVar52 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
              low + (ctx->pi).super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high) * 0.5 -
             ((float)local_168._8_4_ + (float)local_168._12_4_) * 0.5;
    auVar29 = vinsertps_avx(auVar10,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low),
                            0x10);
    auVar30 = vinsertps_avx(*(undefined1 (*) [16])
                             &(ctx->pi).super_Point3<pbrt::Interval>.
                              super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high,
                            ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high),0x10);
    auVar49._0_4_ = (auVar29._0_4_ + auVar30._0_4_) * 0.5;
    auVar49._4_4_ = (auVar29._4_4_ + auVar30._4_4_) * 0.5;
    auVar49._8_4_ = (auVar29._8_4_ + auVar30._8_4_) * 0.5;
    auVar49._12_4_ = (auVar29._12_4_ + auVar30._12_4_) * 0.5;
    auVar29 = vinsertps_avx(auVar23,ZEXT416((uint)local_168._16_4_),0x10);
    auVar30 = vinsertps_avx(auVar25,ZEXT416((uint)local_168._20_4_),0x10);
    auVar51._0_4_ = (auVar29._0_4_ + auVar30._0_4_) * 0.5;
    auVar51._4_4_ = (auVar29._4_4_ + auVar30._4_4_) * 0.5;
    auVar51._8_4_ = (auVar29._8_4_ + auVar30._8_4_) * 0.5;
    auVar51._12_4_ = (auVar29._12_4_ + auVar30._12_4_) * 0.5;
    auVar29 = vsubps_avx(auVar49,auVar51);
    auVar50._0_4_ = auVar29._0_4_ * auVar29._0_4_;
    auVar50._4_4_ = auVar29._4_4_ * auVar29._4_4_;
    auVar50._8_4_ = auVar29._8_4_ * auVar29._8_4_;
    auVar50._12_4_ = auVar29._12_4_ * auVar29._12_4_;
    auVar29 = vmovshdup_avx(auVar50);
    fVar52 = FVar33 / (auVar31._0_4_ / (auVar50._0_4_ + fVar52 * fVar52 + auVar29._0_4_));
    FVar33 = (Float)((uint)(ABS(fVar52) != INFINITY) * (int)fVar52);
  }
  return FVar33;
}

Assistant:

Float BilinearPatch::PDF(const ShapeSampleContext &ctx, Vector3f wi) const {
    // Intersect sample ray with shape geometry
    Ray ray = ctx.SpawnRay(wi);
    pstd::optional<ShapeIntersection> isect = Intersect(ray);
    if (!isect)
        return 0;

    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    // Find normalized vectors to corners of bilinear patch
    Vector3f v00 = Normalize(p00 - ctx.p()), v10 = Normalize(p10 - ctx.p());
    Vector3f v01 = Normalize(p01 - ctx.p()), v11 = Normalize(p11 - ctx.p());

    if (IsRectangle(mesh) && !mesh->imageDistribution &&
        SphericalQuadArea(v00, v10, v11, v01) > MinSphericalSampleArea) {
        // Return PDF for sample in spherical rectangle
        Float pdf = 1 / SphericalQuadArea(v00, v10, v11, v01);
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Compute $\cos \theta$ weights for rectangle seen from _ctx.p()_
            Point3f rp = ctx.p();
            pstd::array<Float, 4> w = pstd::array<Float, 4>{
                std::max<Float>(0.01, AbsDot(Normalize(p00 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p10 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p01 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p11 - rp), ctx.ns))};

            Point2f u = InvertSphericalRectangleSample(rp, p00, p10 - p00, p01 - p00,
                                                       isect->intr.p());
            return BilinearPDF(u, w) * pdf;
        } else
            return pdf;

    } else {
        // Return solid angle PDF for sampling bilinear patch at _intr_
        Float pdf = PDF(isect->intr) / (AbsDot(isect->intr.n, -wi) /
                                        DistanceSquared(ctx.p(), isect->intr.p()));
        if (IsInf(pdf))
            pdf = 0;
        return pdf;
    }
}